

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::
createPrimRefArray_presplit<embree::TriangleMesh,embree::sse2::TriangleSplitterFactory>
          (PrimInfo *__return_storage_ptr__,sse2 *this,Geometry *geometry,uint geomID,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  uint uVar1;
  size_t sVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  runtime_error *prVar7;
  undefined4 in_register_0000000c;
  unsigned_long uVar8;
  size_t sVar9;
  size_t *psVar10;
  ulong uVar11;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *pPVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  size_t taskCount;
  task_group_context context;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  auto_partitioner local_293d;
  uint local_293c;
  unsigned_long local_2938;
  Geometry *local_2930;
  ulong local_2928;
  unsigned_long local_2920;
  mvector<PrimRef> *local_2918;
  mvector<PrimRef> *local_2910;
  long local_2908;
  anon_class_8_1_898bcfc2_conflict4 local_2900;
  anon_class_24_3_3a534e91 local_28f8;
  anon_class_40_5_11684cf9 local_28e0;
  task_group_context local_28b8;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> local_2838;
  
  local_2908 = CONCAT44(in_register_0000000c,geomID);
  local_293c = (uint)geometry;
  local_2930 = (Geometry *)this;
  local_2918 = prims;
  (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
  uVar1 = *(uint *)(this + 0x20);
  local_28f8.geomID = &local_293c;
  local_2920 = 0;
  local_2928 = (ulong)uVar1;
  local_2910 = (mvector<PrimRef> *)numPrimRefs;
  local_28f8.geometry = &local_2930;
  local_28f8.prims = (mvector<PrimRef> *)numPrimRefs;
  iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar11 = (ulong)uVar1 + 0x3ff >> 10;
  if ((ulong)(long)iVar4 < uVar11) {
    uVar11 = (long)iVar4;
  }
  uVar8 = 0x40;
  if (uVar11 < 0x40) {
    uVar8 = uVar11;
  }
  local_28e0.taskCount = &local_2938;
  pPVar12 = &local_2838;
  local_28b8.my_version = proxy_support;
  local_28b8.my_traits = (context_traits)0x4;
  local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_28b8.my_name = CUSTOM_CTX;
  local_2938 = uVar8;
  local_28e0.first = &local_2920;
  local_28e0.last = &local_2928;
  local_28e0.state = pPVar12;
  local_28e0.func = &local_28f8;
  tbb::detail::r1::initialize(&local_28b8);
  local_2900.func = &local_28e0;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,uVar8,1,&local_2900,&local_293d,&local_28b8);
  cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
  if (cVar3 != '\0') {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"task cancelled");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_28b8);
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  aVar13 = _DAT_01f7aa00;
  aVar14 = _DAT_01f7a9f0;
  aVar15 = _DAT_01f7aa00;
  aVar16 = _DAT_01f7a9f0;
  if (local_2938 == 0) {
    lVar6 = 0;
  }
  else {
    sVar9 = 0;
    sVar5 = 0;
    uVar8 = local_2938;
    do {
      pPVar12->sums[0].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0 =
           aVar16;
      pPVar12->sums[0].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0 =
           aVar13;
      pPVar12->sums[0].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0 =
           aVar14;
      pPVar12->sums[0].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0 =
           aVar15;
      sVar2 = __return_storage_ptr__->end;
      pPVar12->sums[0].begin = __return_storage_ptr__->begin;
      pPVar12->sums[0].end = sVar2;
      aVar16.m128 = (__m128)minps(aVar16.m128,
                                  pPVar12->counts[0].super_CentGeom<embree::BBox<embree::Vec3fa>_>.
                                  geomBounds.lower.field_0);
      aVar13.m128 = (__m128)maxps(aVar13.m128,
                                  pPVar12->counts[0].super_CentGeom<embree::BBox<embree::Vec3fa>_>.
                                  geomBounds.upper.field_0);
      aVar14.m128 = (__m128)minps(aVar14.m128,
                                  pPVar12->counts[0].super_CentGeom<embree::BBox<embree::Vec3fa>_>.
                                  centBounds.lower.field_0);
      aVar15.m128 = (__m128)maxps(aVar15.m128,
                                  pPVar12->counts[0].super_CentGeom<embree::BBox<embree::Vec3fa>_>.
                                  centBounds.upper.field_0);
      sVar9 = sVar9 + pPVar12->counts[0].begin;
      sVar5 = sVar5 + pPVar12->counts[0].end;
      __return_storage_ptr__->begin = sVar9;
      __return_storage_ptr__->end = sVar5;
      pPVar12 = (ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
                (pPVar12->counts + 1);
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    lVar6 = sVar5 - sVar9;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar16;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar13;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar14;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar15;
  if (lVar6 != local_2908) {
    (*(code *)((local_2918->alloc).device)->_vptr_MemoryMonitorInterface)(local_2918,0);
    uVar1 = local_2930->numPrimitives;
    local_28f8.geometry = &local_2930;
    local_28f8.prims = local_2910;
    local_28f8.geomID = &local_293c;
    local_2920 = 0;
    local_2928 = (ulong)uVar1;
    iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar11 = (ulong)uVar1 + 0x3ff >> 10;
    if ((ulong)(long)iVar4 < uVar11) {
      uVar11 = (long)iVar4;
    }
    uVar8 = 0x40;
    if (uVar11 < 0x40) {
      uVar8 = uVar11;
    }
    local_28e0.first = &local_2920;
    local_28e0.taskCount = &local_2938;
    local_28e0.state = &local_2838;
    local_28e0.func = &local_28f8;
    local_28b8.my_version = proxy_support;
    local_28b8.my_traits = (context_traits)0x4;
    local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_28b8.my_name = CUSTOM_CTX;
    local_2938 = uVar8;
    local_28e0.last = &local_2928;
    tbb::detail::r1::initialize(&local_28b8);
    local_2900.func = &local_28e0;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,uVar8,1,&local_2900,&local_293d,&local_28b8);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
    if (cVar3 != '\0') {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"task cancelled");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_28b8);
    aVar13 = _DAT_01f7a9f0;
    aVar14 = _DAT_01f7aa00;
    aVar15 = _DAT_01f7aa00;
    aVar16 = _DAT_01f7a9f0;
    if (local_2938 == 0) {
      sVar5 = 0;
      sVar9 = 0;
    }
    else {
      psVar10 = &local_2838.sums[0].end;
      sVar9 = 0;
      sVar5 = 0;
      do {
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -9) = aVar16;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -7) = aVar15;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -5) = aVar13;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar10 + -3) = aVar14;
        psVar10[-1] = sVar5;
        *psVar10 = sVar9;
        aVar16.m128 = (__m128)minps(aVar16.m128,*(undefined1 (*) [16])(psVar10 + -0x289));
        aVar15.m128 = (__m128)maxps(aVar15.m128,*(undefined1 (*) [16])(psVar10 + -0x287));
        aVar13.m128 = (__m128)minps(aVar13.m128,*(undefined1 (*) [16])(psVar10 + -0x285));
        aVar14.m128 = (__m128)maxps(aVar14.m128,*(undefined1 (*) [16])(psVar10 + -0x283));
        sVar5 = sVar5 + psVar10[-0x281];
        sVar9 = sVar9 + psVar10[-0x280];
        psVar10 = psVar10 + 10;
        local_2938 = local_2938 - 1;
      } while (local_2938 != 0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar16;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar15;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar13;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar14;
    __return_storage_ptr__->begin = sVar5;
    __return_storage_ptr__->end = sVar9;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray_presplit(Geometry* geometry, unsigned int geomID, size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelPrefixSumState<PrimInfo> pstate;
      
      /* first try */
      progressMonitor(0);
      PrimInfo pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
	  return geometry->createPrimRefArray(prims,r,r.begin(),geomID);
	}, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
	{
	  progressMonitor(0);
	  pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
	      return geometry->createPrimRefArray(prims,r,base.size(),geomID);
	    }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
	}
      return pinfo;	
    }